

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O0

optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0> __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(dwarf_resolver *this,die_object *cu_die)

{
  source_location location;
  source_location location_00;
  source_location location_01;
  source_location location_02;
  source_location location_03;
  bool bVar1;
  cache_mode cVar2;
  int iVar3;
  pointer ppVar4;
  die_object *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false,_false>,_bool>
  pVar6;
  optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0> oVar7;
  longlong **args_4;
  line_table_info local_238;
  pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info> local_210;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false>
  local_1e0;
  undefined1 local_1d8;
  line_entry *local_1c8;
  line_entry *local_1c0;
  line_entry local_1b8;
  source_location local_170;
  unsigned_long_long *local_160;
  unsigned_long_long local_158;
  Dwarf_Addr addr;
  undefined1 auStack_148 [4];
  int j;
  unsigned_long_long *local_138;
  unsigned_long_long local_130;
  Dwarf_Addr low_addr;
  Dwarf_Line line;
  undefined1 auStack_118 [4];
  int i;
  longlong *local_108;
  Dwarf_Line_s ***local_100;
  Dwarf_Line **local_f8;
  Dwarf_Line_s ***local_f0;
  longlong local_e8;
  Dwarf_Signed linecount_actuals;
  Dwarf_Line *linebuf_actuals;
  Dwarf_Signed line_count;
  Dwarf_Line *line_buffer;
  undefined1 local_b8 [8];
  vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
  line_entries;
  source_location local_88;
  Dwarf_Line_Context_s **local_78;
  uchar *local_70;
  unsigned_long_long *local_68;
  Dwarf_Die local_60;
  int local_54;
  Dwarf_Line_Context_s *pDStack_50;
  int ret;
  Dwarf_Line_Context line_context;
  Dwarf_Unsigned DStack_40;
  Dwarf_Small table_count;
  Dwarf_Unsigned version;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false>
  local_30;
  iterator it;
  Dwarf_Off off;
  die_object *cu_die_local;
  dwarf_resolver *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false>
             )die_object::get_global_offset(in_RDX);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>_>_>
       ::find((unordered_map<unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>_>_>
               *)&cu_die[4].die,(key_type *)&it);
  version = (Dwarf_Unsigned)
            std::
            unordered_map<unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>_>_>
            ::end((unordered_map<unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>_>_>
                   *)&cu_die[4].die);
  bVar1 = std::__detail::operator!=
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false>
                      *)&version);
  if (bVar1) {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false,_false>
                           *)&local_30);
    optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0>::
    optional<cpptrace::detail::libdwarf::line_table_info_&,_0>
              ((optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0> *)
               this,&ppVar4->second);
    uVar5 = extraout_RDX;
  }
  else {
    local_60 = die_object::get(in_RDX);
    local_68 = &stack0xffffffffffffffc0;
    local_70 = (uchar *)((long)&line_context + 7);
    local_78 = &stack0xffffffffffffffb0;
    local_54 = wrap<Dwarf_Die_s_*,_unsigned_long_long_*,_unsigned_char_*,_Dwarf_Line_Context_s_**,_Dwarf_Error_s_**,_Dwarf_Die_s_*,_unsigned_long_long_*,_unsigned_char_*,_Dwarf_Line_Context_s_**,_0>
                         ((dwarf_resolver *)cu_die,dwarf_srclines_b,&local_60,&local_68,&local_70,
                          &local_78);
    source_location::source_location
              (&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
               ,0x27e);
    location.line = local_88.line;
    location._12_4_ = local_88._12_4_;
    location.file = local_88.file;
    assert_impl<bool>(line_context._7_1_ < 3,"Unknown dwarf line table count",verify,
                      "table_count <= 2, \"Unknown dwarf line table count\"",
                      "optional<std::reference_wrapper<line_table_info>> cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(const die_object &)"
                      ,location);
    if (local_54 == -1) {
      optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0>::optional
                ((optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0> *
                 )this);
      uVar5 = extraout_RDX_00;
    }
    else {
      bVar1 = local_54 == 0;
      source_location::source_location
                ((source_location *)
                 &line_entries.
                  super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                 ,0x283);
      location_00.line = local_88.line;
      location_00._12_4_ = local_88._12_4_;
      location_00.file = local_88.file;
      assert_impl<bool>((detail *)(ulong)bVar1,true,0x24d38a,
                        "optional<std::reference_wrapper<line_table_info>> cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(const die_object &)"
                        ,(char *)line_entries.
                                 super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,location_00);
      std::
      vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ::vector((vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                *)local_b8);
      cVar2 = get_cache_mode();
      if (cVar2 == prioritize_speed) {
        line_count = 0;
        linebuf_actuals = (Dwarf_Line *)0x0;
        linecount_actuals = 0;
        local_e8 = 0;
        local_f0 = (Dwarf_Line_s ***)&line_count;
        local_f8 = &linebuf_actuals;
        local_100 = (Dwarf_Line_s ***)&linecount_actuals;
        local_108 = &local_e8;
        args_4 = &local_108;
        iVar3 = wrap<Dwarf_Line_Context_s_*,_Dwarf_Line_s_***,_long_long_*,_Dwarf_Line_s_***,_long_long_*,_Dwarf_Error_s_**,_Dwarf_Line_Context_s_*&,_Dwarf_Line_s_***,_long_long_*,_Dwarf_Line_s_***,_long_long_*,_0>
                          ((dwarf_resolver *)cu_die,dwarf_srclines_two_level_from_linecontext,
                           &stack0xffffffffffffffb0,&local_f0,(longlong **)&local_f8,&local_100,
                           args_4);
        source_location::source_location
                  ((source_location *)auStack_118,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                   ,0x296);
        location_01.line = local_88.line;
        location_01._12_4_ = local_88._12_4_;
        location_01.file = (char *)args_4;
        assert_impl<bool>((detail *)(ulong)(iVar3 == 0),true,0x24d147,
                          "optional<std::reference_wrapper<line_table_info>> cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(const die_object &)"
                          ,_auStack_118,location_01);
        std::
        vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
        ::reserve((vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                   *)local_b8,(size_type)linebuf_actuals);
        line._4_4_ = 0;
        uVar5 = local_88._8_8_;
        while ((long)line._4_4_ < (long)linebuf_actuals) {
          low_addr = *(Dwarf_Addr *)(line_count + (long)line._4_4_ * 8);
          local_130 = 0;
          local_138 = &local_130;
          iVar3 = wrap<Dwarf_Line_s_*,_unsigned_long_long_*,_Dwarf_Error_s_**,_Dwarf_Line_s_*&,_unsigned_long_long_*,_0>
                            ((dwarf_resolver *)cu_die,dwarf_lineaddr,(Dwarf_Line_s **)&low_addr,
                             &local_138);
          source_location::source_location
                    ((source_location *)auStack_148,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                     ,0x29d);
          location_02.line = (int)uVar5;
          location_02._12_4_ = SUB84(uVar5,4);
          location_02.file = (char *)args_4;
          assert_impl<bool>((detail *)(ulong)(iVar3 == 0),true,0x24d39b,
                            "optional<std::reference_wrapper<line_table_info>> cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(const die_object &)"
                            ,_auStack_148,location_02);
          addr._4_4_ = line._4_4_;
          do {
            addr._4_4_ = addr._4_4_ + 1;
            if ((long)linebuf_actuals <= (long)addr._4_4_) break;
            local_158 = 0;
            local_160 = &local_158;
            iVar3 = wrap<Dwarf_Line_s_*,_unsigned_long_long_*,_Dwarf_Error_s_**,_Dwarf_Line_s_*&,_unsigned_long_long_*,_0>
                              ((dwarf_resolver *)cu_die,dwarf_lineaddr,
                               (Dwarf_Line_s **)(line_count + (long)addr._4_4_ * 8),&local_160);
            source_location::source_location
                      (&local_170,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                       ,0x2a2);
            location_03.line = (int)uVar5;
            location_03._12_4_ = SUB84(uVar5,4);
            location_03.file = (char *)args_4;
            assert_impl<bool>((detail *)(ulong)(iVar3 == 0),true,0x24d3ce,
                              "optional<std::reference_wrapper<line_table_info>> cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(const die_object &)"
                              ,local_170.file,location_03);
          } while (local_158 == local_130);
          low_addr = *(undefined8 *)(line_count + (long)(addr._4_4_ + -1) * 8);
          line_entry::line_entry(&local_1b8,local_130,(Dwarf_Line)low_addr);
          std::
          vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
          ::push_back((vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                       *)local_b8,&local_1b8);
          line_entry::~line_entry(&local_1b8);
          line._4_4_ = addr._4_4_;
        }
        local_1c0 = (line_entry *)
                    std::
                    vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                    ::begin((vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                             *)local_b8);
        local_1c8 = (line_entry *)
                    std::
                    vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                    ::end((vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                           *)local_b8);
        std::
        sort<__gnu_cxx::__normal_iterator<cpptrace::detail::libdwarf::line_entry*,std::vector<cpptrace::detail::libdwarf::line_entry,std::allocator<cpptrace::detail::libdwarf::line_entry>>>,cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(cpptrace::detail::libdwarf::die_object_const&)::_lambda(cpptrace::detail::libdwarf::line_entry_const&,cpptrace::detail::libdwarf::line_entry_const&)_1_>
                  (local_1c0,local_1c8);
      }
      local_238.version = DStack_40;
      local_238.line_context = pDStack_50;
      std::
      vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ::vector(&local_238.line_entries,
               (vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                *)local_b8);
      std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>::
      pair<unsigned_long_long_&,_true>(&local_210,(unsigned_long_long *)&it,&local_238);
      pVar6 = std::
              unordered_map<unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>_>_>
              ::insert((unordered_map<unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>_>_>
                        *)&cu_die[4].die,&local_210);
      local_1e0._M_cur =
           (__node_type *)
           pVar6.first.
           super__Node_iterator_base<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false>
           ._M_cur;
      local_1d8 = pVar6.second;
      local_30._M_cur = local_1e0._M_cur;
      std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>::~pair
                (&local_210);
      line_table_info::~line_table_info(&local_238);
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false,_false>
                             *)&local_30);
      optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0>::
      optional<cpptrace::detail::libdwarf::line_table_info_&,_0>
                ((optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0> *
                 )this,&ppVar4->second);
      std::
      vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ::~vector((vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                 *)local_b8);
      uVar5 = extraout_RDX_01;
    }
  }
  oVar7._8_8_ = uVar5;
  oVar7.field_0 =
       (anon_union_8_2_d41c7fdf_for_optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0>_2
        )this;
  return oVar7;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        optional<std::reference_wrapper<line_table_info>> get_line_table(const die_object& cu_die) {
            auto off = cu_die.get_global_offset();
            auto it = line_tables.find(off);
            if(it != line_tables.end()) {
                return it->second;
            } else {
                Dwarf_Unsigned version;
                Dwarf_Small table_count;
                Dwarf_Line_Context line_context;
                int ret = wrap(
                    dwarf_srclines_b,
                    cu_die.get(),
                    &version,
                    &table_count,
                    &line_context
                );
                static_assert(std::is_unsigned<decltype(table_count)>::value, "Expected unsigned Dwarf_Small");
                VERIFY(/*table_count >= 0 &&*/ table_count <= 2, "Unknown dwarf line table count");
                if(ret == DW_DLV_NO_ENTRY) {
                    // TODO: Failing silently for now
                    return nullopt;
                }
                VERIFY(ret == DW_DLV_OK);

                std::vector<line_entry> line_entries;

                if(get_cache_mode() == cache_mode::prioritize_speed) {
                    // build lookup table
                    Dwarf_Line* line_buffer = nullptr;
                    Dwarf_Signed line_count = 0;
                    Dwarf_Line* linebuf_actuals = nullptr;
                    Dwarf_Signed linecount_actuals = 0;
                    VERIFY(
                        wrap(
                            dwarf_srclines_two_level_from_linecontext,
                            line_context,
                            &line_buffer,
                            &line_count,
                            &linebuf_actuals,
                            &linecount_actuals
                        ) == DW_DLV_OK
                    );

                    // TODO: Make any attempt to note PC ranges? Handle line end sequence?
                    line_entries.reserve(line_count);
                    for(int i = 0; i < line_count; i++) {
                        Dwarf_Line line = line_buffer[i];
                        Dwarf_Addr low_addr = 0;
                        VERIFY(wrap(dwarf_lineaddr, line, &low_addr) == DW_DLV_OK);
                        // scan ahead for the last line entry matching this pc
                        int j;
                        for(j = i + 1; j < line_count; j++) {
                            Dwarf_Addr addr = 0;
                            VERIFY(wrap(dwarf_lineaddr, line_buffer[j], &addr) == DW_DLV_OK);
                            if(addr != low_addr) {
                                break;
                            }
                        }
                        line = line_buffer[j - 1];
                        // {
                        //     Dwarf_Unsigned line_number = 0;
                        //     VERIFY(wrap(dwarf_lineno, line, &line_number) == DW_DLV_OK);
                        //     frame.line = static_cast<std::uint32_t>(line_number);
                        //     char* filename = nullptr;
                        //     VERIFY(wrap(dwarf_linesrc, line, &filename) == DW_DLV_OK);
                        //     auto wrapper = raii_wrap(
                        //         filename,
                        //         [this] (char* str) { if(str) dwarf_dealloc(dbg, str, DW_DLA_STRING); }
                        //     );
                        //     frame.filename = filename;
                        //     printf("%s : %d\n", filename, line_number);
                        //     Dwarf_Bool is_line_end;
                        //     VERIFY(wrap(dwarf_lineendsequence, line, &is_line_end) == DW_DLV_OK);
                        //     if(is_line_end) {
                        //         puts("Line end");
                        //     }
                        // }
                        line_entries.push_back({
                            low_addr,
                            line
                        });
                        i = j - 1;
                    }
                    // sort lines
                    std::sort(line_entries.begin(), line_entries.end(), [] (const line_entry& a, const line_entry& b) {
                        return a.low < b.low;
                    });
                }

                it = line_tables.insert({off, {version, line_context, std::move(line_entries)}}).first;
                return it->second;
            }
        }